

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O1

bool __thiscall llvm::Twine::isValid(Twine *this)

{
  NodeKind NVar1;
  NodeKind NVar2;
  bool bVar3;
  
  NVar1 = this->LHSKind;
  if ((((NVar1 < TwineKind) && (this->RHSKind != EmptyKind)) ||
      (NVar2 = this->RHSKind, NVar2 == NullKind)) || ((NVar2 != EmptyKind && (NVar1 == EmptyKind))))
  {
    bVar3 = false;
  }
  else {
    if (NVar1 == TwineKind) {
      if (((this->LHS).twine)->LHSKind == NullKind) {
        return false;
      }
      if (((this->LHS).twine)->RHSKind == EmptyKind) {
        return false;
      }
    }
    if (NVar2 == TwineKind) {
      if (((this->RHS).twine)->LHSKind == NullKind) {
        return false;
      }
      if (((this->RHS).twine)->RHSKind == EmptyKind) {
        return false;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool isValid() const {
      // Nullary twines always have Empty on the RHS.
      if (isNullary() && getRHSKind() != EmptyKind)
        return false;

      // Null should never appear on the RHS.
      if (getRHSKind() == NullKind)
        return false;

      // The RHS cannot be non-empty if the LHS is empty.
      if (getRHSKind() != EmptyKind && getLHSKind() == EmptyKind)
        return false;

      // A twine child should always be binary.
      if (getLHSKind() == TwineKind &&
          !LHS.twine->isBinary())
        return false;
      if (getRHSKind() == TwineKind &&
          !RHS.twine->isBinary())
        return false;

      return true;
    }